

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerNewScGenFuncHomeObj(Lowerer *this,Instr *newScFuncInstr)

{
  HelperCallOpnd *newSrc;
  Opnd *newSrc_00;
  
  newScFuncInstr->m_opcode = CallHelper;
  newSrc = IR::HelperCallOpnd::New(HelperScrFunc_OP_NewScGenFuncHomeObj,this->m_func);
  newSrc_00 = IR::Instr::UnlinkSrc1(newScFuncInstr);
  IR::Instr::SetSrc1(newScFuncInstr,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(newScFuncInstr,newSrc_00);
  return newScFuncInstr;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScGenFuncHomeObj(IR::Instr * newScFuncInstr)
{
    newScFuncInstr->m_opcode = Js::OpCode::CallHelper;
    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(IR::HelperScrFunc_OP_NewScGenFuncHomeObj, this->m_func);

    IR::Opnd * src1 = newScFuncInstr->UnlinkSrc1();
    newScFuncInstr->SetSrc1(helperOpnd);
    newScFuncInstr->SetSrc2(src1);

    return newScFuncInstr;
}